

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

bool __thiscall LTFlightData::TryGetSafeCopy(LTFlightData *this,FDDynamicData *outDyn)

{
  _Elt_pointer pFVar1;
  int iVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  unique_lock<std::recursive_mutex> lock;
  undefined4 uStack_50;
  undefined3 uStack_4c;
  double local_48;
  double dStack_40;
  double local_38;
  LTChannel *pLStack_30;
  unique_lock<std::recursive_mutex> local_20;
  
  local_20._M_device = &this->dataAccessMutex;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)local_20._M_device);
  local_20._M_owns = iVar2 == 0;
  if (local_20._M_owns) {
    pFVar1 = (this->dynDataDeque).
             super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->dynDataDeque).
        super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pFVar1) {
      local_38 = 0.0;
      pLStack_30 = (LTChannel *)0x0;
      local_48 = 0.0;
      dStack_40 = 0.0;
      uVar4 = SUB168(ZEXT416(2),0);
      uVar5 = 0x18;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      dVar9 = NAN;
      bVar3 = false;
    }
    else {
      uVar5 = (undefined4)(pFVar1->radar).size;
      uVar6 = *(undefined4 *)((long)&(pFVar1->radar).size + 4);
      uVar7 = (undefined4)(pFVar1->radar).code;
      uVar8 = *(undefined4 *)((long)&(pFVar1->radar).code + 4);
      uVar4 = *(undefined8 *)&(pFVar1->radar).mode;
      bVar3 = pFVar1->gnd;
      uStack_4c = (undefined3)((uint)*(undefined4 *)&pFVar1->field_0x1c >> 8);
      uStack_50 = *(undefined4 *)&pFVar1->field_0x19;
      dVar9 = pFVar1->heading;
      local_48 = pFVar1->spd;
      dStack_40 = pFVar1->vsi;
      local_38 = pFVar1->ts;
      pLStack_30 = pFVar1->pChannel;
    }
    *(undefined4 *)&(outDyn->radar).size = uVar5;
    *(undefined4 *)((long)&(outDyn->radar).size + 4) = uVar6;
    *(undefined4 *)&(outDyn->radar).code = uVar7;
    *(undefined4 *)((long)&(outDyn->radar).code + 4) = uVar8;
    *(undefined8 *)&(outDyn->radar).mode = uVar4;
    outDyn->gnd = bVar3;
    *(undefined4 *)&outDyn->field_0x19 = uStack_50;
    *(uint *)&outDyn->field_0x1c = CONCAT31(uStack_4c,uStack_50._3_1_);
    outDyn->heading = dVar9;
    outDyn->spd = local_48;
    outDyn->vsi = dStack_40;
    outDyn->ts = local_38;
    outDyn->pChannel = pLStack_30;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  return iVar2 == 0;
}

Assistant:

bool LTFlightData::TryGetSafeCopy ( FDDynamicData& outDyn ) const
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // we got the lock, return a copy of the data
            outDyn = dynDataDeque.empty() ? FDDynamicData() : dynDataDeque.front();
            // Success!
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}